

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

int sys_pollgui(void)

{
  int iVar1;
  t_guiqueue *fatso;
  _instanceinter *p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  t_guiqueue *headwas;
  double dVar7;
  
  uVar4 = 0;
  uVar3 = sys_domicrosleep(0);
  if (uVar3 == 0) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = sys_getrealtime();
    if (dVar7 <= sys_pollgui::lasttime + 0.5) {
      return 1;
    }
  }
  uVar5 = 0;
  if (((pd_maininstance.pd_inter)->i_havegui != 0) &&
     (sys_flushtogui(), uVar5 = uVar4,
     (pd_maininstance.pd_inter)->i_guihead <= (pd_maininstance.pd_inter)->i_guitail)) {
    iVar1 = (pd_maininstance.pd_inter)->i_bytessincelastping;
    iVar6 = 0x7fffffff;
    if (iVar1 < 0x101) {
      iVar6 = iVar1 + 0x200;
    }
    if (((pd_maininstance.pd_inter)->i_waitingforping == 0) &&
       ((pd_maininstance.pd_inter)->i_guiqueuehead != (t_guiqueue *)0x0)) {
      do {
        if (0x3ff < iVar1) {
          sys_vgui("%s","pdtk_ping\n");
          p_Var2 = pd_maininstance.pd_inter;
          p_Var2->i_waitingforping = 1;
          p_Var2->i_bytessincelastping = 0;
          goto LAB_00172689;
        }
        fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
        if (fatso == (t_guiqueue *)0x0) break;
        (pd_maininstance.pd_inter)->i_guiqueuehead = fatso->gq_next;
        (*fatso->gq_fn)((t_gobj *)fatso->gq_client,fatso->gq_glist);
        freebytes(fatso,0x20);
        iVar1 = (pd_maininstance.pd_inter)->i_bytessincelastping;
      } while (iVar1 < iVar6);
      sys_flushtogui();
LAB_00172689:
      uVar5 = 1;
    }
  }
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    sys_pollgui::lasttime = dVar7;
  }
  return uVar5 | uVar3;
}

Assistant:

int sys_pollgui(void)
{
    static double lasttime = 0;
    double now = 0;
    int didsomething = sys_domicrosleep(0);
    if (!didsomething || (now = sys_getrealtime()) > lasttime + 0.5)
    {
        didsomething |= sys_poll_togui();
        if (now)
            lasttime = now;
    }
    return (didsomething);
}